

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lq.c
# Opt level: O2

void lqUpdateForNewLocation(lqInternalDB *lq,lqClientProxy *object,float x,float y,float z)

{
  lqClientProxy **bin;
  
  bin = lqBinForLocation(lq,x,y,z);
  object->x = x;
  object->y = y;
  object->z = z;
  if (bin != object->bin) {
    lqRemoveFromBin(object);
    lqAddToBin(object,bin);
    return;
  }
  return;
}

Assistant:

void lqUpdateForNewLocation  (lqInternalDB* lq, 
			      lqClientProxy* object, 
			      float x, float y, float z)
{
    /* find bin for new location */
    lqClientProxy** newBin = lqBinForLocation (lq, x, y, z);

    /* store location in client object, for future reference */
    object->x = x;
    object->y = y;
    object->z = z;

    /* has object moved into a new bin? */
    if (newBin != object->bin)
    {
	lqRemoveFromBin (object);
 	lqAddToBin (object, newBin);
    }
}